

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

iterator __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::findNextMeshPoint
          (MultipleShootingTranscription *this,iterator *start)

{
  bool bVar1;
  undefined8 *in_RSI;
  MeshPointOrigin ignored;
  iterator nextMesh;
  MeshPointOrigin *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
  local_8;
  
  local_8._M_current = (anon_struct_112_6_78b70dfe *)*in_RSI;
  MeshPointOrigin::Ignored();
  do {
    __gnu_cxx::
    __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
    ::operator++(&local_8);
    __gnu_cxx::
    __normal_iterator<iDynTree::optimalcontrol::MeshPoint_*,_std::vector<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>_>
    ::operator->(&local_8);
    bVar1 = MeshPointOrigin::operator==
                      ((MeshPointOrigin *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff90 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff90);
  } while (bVar1);
  MeshPointOrigin::~MeshPointOrigin
            ((MeshPointOrigin *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  return (iterator)local_8._M_current;
}

Assistant:

std::vector<MeshPoint>::iterator findNextMeshPoint(const std::vector<MeshPoint>::iterator& start){
                std::vector<MeshPoint>::iterator nextMesh = start;
                MeshPointOrigin ignored = MeshPointOrigin::Ignored();
                assert(nextMesh != m_meshPoints.end());
                assert(nextMesh->origin.name().size() > 0);
                do {
                    ++nextMesh;
                    assert(nextMesh->origin.name().size() > 0);
                    assert(nextMesh != m_meshPoints.end());
                } while (nextMesh->origin == ignored); //find next valid mesh

                return nextMesh;
            }